

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3VdbeExpandSql(Vdbe *p,char *zRawSql)

{
  ushort uVar1;
  sqlite3 *psVar2;
  Mem *pMVar3;
  uint uVar4;
  Vdbe *pVVar5;
  char cVar6;
  uchar uVar7;
  int nName;
  int iVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  uchar *puVar12;
  ulong uVar13;
  int nTotal;
  int iVar14;
  int idx;
  sqlite3_str local_a8;
  int tokenType;
  Vdbe *local_78;
  sqlite3 *local_70;
  Mem utf8;
  
  idx = 0;
  psVar2 = p->db;
  local_a8.mxAlloc = psVar2->aLimit[0];
  local_a8.db = (sqlite3 *)0x0;
  local_a8.zText = (char *)0x0;
  local_a8.nAlloc = 0;
  local_a8.nChar = 0;
  local_a8.accError = '\0';
  local_a8.printfFlags = '\0';
  if (psVar2->nVdbeExec < 2) {
    if (p->nVar == 0) {
      iVar8 = sqlite3Strlen30(zRawSql);
      sqlite3_str_append(&local_a8,zRawSql,iVar8);
    }
    else {
      iVar8 = 1;
      local_78 = p;
      local_70 = psVar2;
      while (*zRawSql != '\0') {
        uVar7 = '\x01';
        iVar14 = 0;
        puVar12 = (uchar *)zRawSql;
        while ((nName = 0, uVar7 != '\0' &&
               (nName = sqlite3GetToken(puVar12,&tokenType), tokenType != 0x9c))) {
          iVar14 = iVar14 + nName;
          uVar7 = puVar12[nName];
          puVar12 = puVar12 + nName;
        }
        sqlite3_str_append(&local_a8,zRawSql,iVar14);
        pVVar5 = local_78;
        if (nName == 0) break;
        puVar12 = (uchar *)zRawSql + iVar14;
        if (*puVar12 == '?') {
          iVar14 = iVar8;
          if (1 < nName) {
            sqlite3GetInt32((char *)(puVar12 + 1),&idx);
            iVar14 = idx;
          }
        }
        else {
          iVar14 = sqlite3VdbeParameterIndex(local_78,(char *)puVar12,nName);
        }
        idx = iVar14;
        zRawSql = (char *)(puVar12 + nName);
        if (iVar8 < idx + 1) {
          iVar8 = idx + 1;
        }
        pMVar3 = pVVar5->aVar;
        lVar9 = (long)idx;
        uVar1 = pMVar3[lVar9 + -1].flags;
        if ((uVar1 & 1) == 0) {
          if ((uVar1 & 0x24) == 0) {
            if ((uVar1 & 8) == 0) {
              if ((uVar1 & 2) == 0) {
                if ((uVar1 >> 10 & 1) == 0) {
                  sqlite3_str_append(&local_a8,"x\'",2);
                  uVar4 = pMVar3[lVar9 + -1].n;
                  if (pMVar3[lVar9 + -1].n < 1) {
                    uVar4 = 0;
                  }
                  for (uVar13 = 0; uVar4 != uVar13; uVar13 = uVar13 + 1) {
                    sqlite3_str_appendf(&local_a8,"%02x",(ulong)(byte)pMVar3[lVar9 + -1].z[uVar13]);
                  }
                  sqlite3_str_append(&local_a8,"\'",1);
                }
                else {
                  sqlite3_str_appendf(&local_a8,"zeroblob(%d)",
                                      (ulong)(uint)pMVar3[lVar9 + -1].u.nZero);
                }
              }
              else if (local_70->enc == '\x01') {
                sqlite3_str_appendf(&local_a8,"\'%.*q\'",(ulong)(uint)pMVar3[lVar9 + -1].n,
                                    pMVar3[lVar9 + -1].z);
              }
              else {
                utf8.n = 0;
                utf8.flags = 0;
                utf8.enc = '\0';
                utf8.eSubtype = '\0';
                utf8.szMalloc = 0;
                utf8.uTemp = 0;
                utf8.zMalloc = (char *)0x0;
                utf8.xDel = (_func_void_void_ptr *)0x0;
                utf8.u.r = 0.0;
                utf8.z = (char *)0x0;
                utf8.db = local_70;
                sqlite3VdbeMemSetStr
                          (&utf8,pMVar3[lVar9 + -1].z,(long)pMVar3[lVar9 + -1].n,local_70->enc,
                           (_func_void_void_ptr *)0x0);
                iVar14 = sqlite3VdbeChangeEncoding(&utf8,1);
                if (iVar14 == 7) {
                  local_a8.accError = '\a';
                  local_a8.nAlloc = 0;
                }
                sqlite3_str_appendf(&local_a8,"\'%.*q\'",utf8._16_8_ & 0xffffffff,utf8.z);
                sqlite3VdbeMemRelease(&utf8);
              }
            }
            else {
              sqlite3_str_appendf(&local_a8,"%!.15g",pMVar3[lVar9 + -1].u.nZero);
            }
          }
          else {
            sqlite3_str_appendf(&local_a8,"%lld",pMVar3[lVar9 + -1].u.r);
          }
        }
        else {
          sqlite3_str_append(&local_a8,"NULL",4);
        }
      }
    }
  }
  else {
    for (; cVar6 = *zRawSql, lVar9 = 1, cVar6 != '\0'; zRawSql = zRawSql + lVar11) {
      do {
        lVar11 = lVar9;
        if (cVar6 == '\n') break;
        cVar6 = zRawSql[lVar11];
        lVar9 = lVar11 + 1;
      } while (cVar6 != '\0');
      sqlite3_str_append(&local_a8,"-- ",3);
      sqlite3_str_append(&local_a8,zRawSql,(int)lVar11);
    }
  }
  if (local_a8.accError != '\0') {
    sqlite3_str_reset(&local_a8);
  }
  pcVar10 = sqlite3StrAccumFinish(&local_a8);
  return pcVar10;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VdbeExpandSql(
  Vdbe *p,                 /* The prepared statement being evaluated */
  const char *zRawSql      /* Raw text of the SQL statement */
){
  sqlite3 *db;             /* The database connection */
  int idx = 0;             /* Index of a host parameter */
  int nextIndex = 1;       /* Index of next ? host parameter */
  int n;                   /* Length of a token prefix */
  int nToken;              /* Length of the parameter token */
  int i;                   /* Loop counter */
  Mem *pVar;               /* Value of a host parameter */
  StrAccum out;            /* Accumulate the output here */
#ifndef SQLITE_OMIT_UTF16
  Mem utf8;                /* Used to convert UTF16 into UTF8 for display */
#endif

  db = p->db;
  sqlite3StrAccumInit(&out, 0, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
  if( db->nVdbeExec>1 ){
    while( *zRawSql ){
      const char *zStart = zRawSql;
      while( *(zRawSql++)!='\n' && *zRawSql );
      sqlite3_str_append(&out, "-- ", 3);
      assert( (zRawSql - zStart) > 0 );
      sqlite3_str_append(&out, zStart, (int)(zRawSql-zStart));
    }
  }else if( p->nVar==0 ){
    sqlite3_str_append(&out, zRawSql, sqlite3Strlen30(zRawSql));
  }else{
    while( zRawSql[0] ){
      n = findNextHostParameter(zRawSql, &nToken);
      assert( n>0 );
      sqlite3_str_append(&out, zRawSql, n);
      zRawSql += n;
      assert( zRawSql[0] || nToken==0 );
      if( nToken==0 ) break;
      if( zRawSql[0]=='?' ){
        if( nToken>1 ){
          assert( sqlite3Isdigit(zRawSql[1]) );
          sqlite3GetInt32(&zRawSql[1], &idx);
        }else{
          idx = nextIndex;
        }
      }else{
        assert( zRawSql[0]==':' || zRawSql[0]=='$' ||
                zRawSql[0]=='@' || zRawSql[0]=='#' );
        testcase( zRawSql[0]==':' );
        testcase( zRawSql[0]=='$' );
        testcase( zRawSql[0]=='@' );
        testcase( zRawSql[0]=='#' );
        idx = sqlite3VdbeParameterIndex(p, zRawSql, nToken);
        assert( idx>0 );
      }
      zRawSql += nToken;
      nextIndex = MAX(idx + 1, nextIndex);
      assert( idx>0 && idx<=p->nVar );
      pVar = &p->aVar[idx-1];
      if( pVar->flags & MEM_Null ){
        sqlite3_str_append(&out, "NULL", 4);
      }else if( pVar->flags & (MEM_Int|MEM_IntReal) ){
        sqlite3_str_appendf(&out, "%lld", pVar->u.i);
      }else if( pVar->flags & MEM_Real ){
        sqlite3_str_appendf(&out, "%!.15g", pVar->u.r);
      }else if( pVar->flags & MEM_Str ){
        int nOut;  /* Number of bytes of the string text to include in output */
#ifndef SQLITE_OMIT_UTF16
        u8 enc = ENC(db);
        if( enc!=SQLITE_UTF8 ){
          memset(&utf8, 0, sizeof(utf8));
          utf8.db = db;
          sqlite3VdbeMemSetStr(&utf8, pVar->z, pVar->n, enc, SQLITE_STATIC);
          if( SQLITE_NOMEM==sqlite3VdbeChangeEncoding(&utf8, SQLITE_UTF8) ){
            out.accError = SQLITE_NOMEM;
            out.nAlloc = 0;
          }
          pVar = &utf8;
        }
#endif
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ){
          nOut = SQLITE_TRACE_SIZE_LIMIT;
          while( nOut<pVar->n && (pVar->z[nOut]&0xc0)==0x80 ){ nOut++; }
        }
#endif
        sqlite3_str_appendf(&out, "'%.*q'", nOut, pVar->z);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
#ifndef SQLITE_OMIT_UTF16
        if( enc!=SQLITE_UTF8 ) sqlite3VdbeMemRelease(&utf8);
#endif
      }else if( pVar->flags & MEM_Zero ){
        sqlite3_str_appendf(&out, "zeroblob(%d)", pVar->u.nZero);
      }else{
        int nOut;  /* Number of bytes of the blob to include in output */
        assert( pVar->flags & MEM_Blob );
        sqlite3_str_append(&out, "x'", 2);
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ) nOut = SQLITE_TRACE_SIZE_LIMIT;
#endif
        for(i=0; i<nOut; i++){
          sqlite3_str_appendf(&out, "%02x", pVar->z[i]&0xff);
        }
        sqlite3_str_append(&out, "'", 1);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
      }
    }
  }
  if( out.accError ) sqlite3_str_reset(&out);
  return sqlite3StrAccumFinish(&out);
}